

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O1

char * effect_projection(effect *effect)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *__s1;
  char *__s2;
  char *pcVar5;
  int iVar6;
  effect *effect_00;
  
  uVar1 = effect->index;
  if ((uVar1 == 0x7a) || (uVar1 == 1)) {
    iVar3 = dice_evaluate(effect->dice,0,AVERAGE,(random_value *)0x0);
    pcVar5 = "";
    __s1 = pcVar5;
    if ((0 < iVar3) && (effect_00 = effect->next, effect_00 != (effect *)0x0)) {
      __s1 = effect_projection(effect_00);
      iVar6 = 1;
      do {
        __s2 = effect_projection(effect_00);
        iVar4 = strcmp(__s1,__s2);
        if (iVar4 != 0) {
          return pcVar5;
        }
        effect_00 = effect_00->next;
        if (effect_00 == (effect *)0x0) {
          return __s1;
        }
        bVar2 = iVar6 < iVar3;
        iVar6 = iVar6 + 1;
      } while (bVar2);
    }
  }
  else {
    __s1 = "";
    if ((projections[effect->subtype].player_desc != (char *)0x0) &&
       ((base_descs[uVar1].efinfo_flag - 0xcU < 4 || (base_descs[uVar1].efinfo_flag == 0x12)))) {
      __s1 = projections[effect->subtype].player_desc;
    }
  }
  return __s1;
}

Assistant:

const char *effect_projection(const struct effect *effect)
{
	if (effect->index == EF_RANDOM || effect->index == EF_SELECT) {
		// Random or select effect
		int num_subeffects = dice_evaluate(effect->dice, 0, AVERAGE, NULL);
		struct effect *e;
		const char *subeffect_proj;

		// Check if all subeffects have the same projection, and if
		// not just give up on it
		if (num_subeffects <= 0 || !effect->next) {
			return "";
		}

		e = effect->next;
		subeffect_proj = effect_projection(e);
		for (int i = 0; e != NULL && i < num_subeffects; i++) {
			if (!streq(subeffect_proj, effect_projection(e))) {
				return "";
			}
			e = e->next;
		}

		return subeffect_proj;
	} else if (projections[effect->subtype].player_desc != NULL) {
		// Non-random effect, extract the projection if there is one
		switch (base_descs[effect->index].efinfo_flag) {
			case EFINFO_BALL:
			case EFINFO_BOLTD:
			case EFINFO_BREATH:
			case EFINFO_SHORT:
			case EFINFO_SPOT:
				return projections[effect->subtype].player_desc;
		}
	}

	return "";
}